

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong wpos_00;
  bool bVar6;
  ulong local_d8;
  size_t local_d0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint skip;
  uint chainlength;
  size_t wpos;
  uchar *puStack_a0;
  uint hashpos;
  uchar *backptr;
  uchar *foreptr;
  uchar *lastptr;
  uint prev_offset;
  uint current_length;
  uint current_offset;
  uint hashval;
  uint lazyoffset;
  uint lazylength;
  uint lazy;
  uint length;
  uint offset;
  uint numzeros;
  uint usezeros;
  uint maxlazymatch;
  uint maxchainlength;
  uint error;
  uint i;
  size_t pos;
  uint windowsize_local;
  size_t insize_local;
  size_t inpos_local;
  uchar *in_local;
  Hash *hash_local;
  uivector *out_local;
  
  local_bc = windowsize;
  if (windowsize < 0x2000) {
    local_bc = windowsize >> 3;
  }
  uVar2 = 0x40;
  if (0x1fff < windowsize) {
    uVar2 = 0x102;
  }
  length = 0;
  bVar1 = false;
  hashval = 0;
  current_offset = 0;
  if ((windowsize == 0) || (0x8000 < windowsize)) {
    return 0x3c;
  }
  if ((windowsize & windowsize - 1) != 0) {
    return 0x5a;
  }
  _error = inpos;
  if (0x102 < nicematch) {
    nicematch = 0x102;
  }
  do {
    if (insize <= _error) {
      return 0;
    }
    wpos_00 = _error & windowsize - 1;
    local_b4 = 0;
    uVar3 = getHash(in,insize,_error);
    if (uVar3 == 0) {
      if (length == 0) {
        length = countZeros(in,insize,_error);
      }
      else if ((insize < _error + length) || (in[_error + length + -1] != '\0')) {
        length = length - 1;
      }
    }
    else {
      length = 0;
    }
    updateHashChain(hash,wpos_00,uVar3,(unsigned_short)length);
    lazylength = 0;
    lazy = 0;
    wpos._4_4_ = (uint)hash->chain[wpos_00];
    local_d0 = insize;
    if (_error + 0x102 <= insize) {
      local_d0 = _error + 0x102;
    }
    lastptr._4_4_ = 0;
    do {
      while( true ) {
        if (local_bc <= local_b4) goto LAB_0012b40c;
        if (wpos_00 < wpos._4_4_) {
          local_d8 = (wpos_00 - wpos._4_4_) + (ulong)windowsize;
        }
        else {
          local_d8 = wpos_00 - wpos._4_4_;
        }
        uVar4 = (uint)local_d8;
        if (uVar4 < lastptr._4_4_) goto LAB_0012b40c;
        if (uVar4 != 0) {
          backptr = in + _error;
          puStack_a0 = in + (_error - (local_d8 & 0xffffffff));
          if (2 < length) {
            local_b8 = (uint)hash->zeros[wpos._4_4_];
            if (length < local_b8) {
              local_b8 = length;
            }
            puStack_a0 = puStack_a0 + local_b8;
            backptr = backptr + local_b8;
          }
          while( true ) {
            bVar6 = false;
            if (backptr != in + local_d0) {
              bVar6 = *puStack_a0 == *backptr;
            }
            if (!bVar6) break;
            puStack_a0 = puStack_a0 + 1;
            backptr = backptr + 1;
          }
          uVar5 = (int)backptr - ((int)in + (int)_error);
          if ((lazylength < uVar5) && (lazylength = uVar5, lazy = uVar4, nicematch <= uVar5))
          goto LAB_0012b40c;
        }
        if (wpos._4_4_ == hash->chain[wpos._4_4_]) goto LAB_0012b40c;
        lastptr._4_4_ = uVar4;
        if ((length < 3) || (lazylength <= length)) break;
        wpos._4_4_ = (uint)hash->chainz[wpos._4_4_];
        local_b4 = local_b4 + 1;
        if (hash->zeros[wpos._4_4_] != length) goto LAB_0012b40c;
      }
      wpos._4_4_ = (uint)hash->chain[wpos._4_4_];
      local_b4 = local_b4 + 1;
    } while (hash->val[wpos._4_4_] == uVar3);
LAB_0012b40c:
    if (lazymatching == 0) {
LAB_0012b4e9:
      if ((2 < lazylength) && (windowsize < lazy)) {
        return 0x56;
      }
      if (lazylength < 3) {
        uVar3 = uivector_push_back(out,(uint)in[_error]);
        if (uVar3 == 0) {
          return 0x53;
        }
      }
      else if ((lazylength < minmatch) || ((lazylength == 3 && (0x1000 < lazy)))) {
        uVar3 = uivector_push_back(out,(uint)in[_error]);
        if (uVar3 == 0) {
          return 0x53;
        }
      }
      else {
        addLengthDistance(out,(ulong)lazylength,(ulong)lazy);
        for (maxchainlength = 1; maxchainlength < lazylength; maxchainlength = maxchainlength + 1) {
          _error = _error + 1;
          uVar3 = getHash(in,insize,_error);
          if (uVar3 == 0) {
            if (length == 0) {
              length = countZeros(in,insize,_error);
            }
            else if ((insize < _error + length) || (in[_error + length + -1] != '\0')) {
              length = length - 1;
            }
          }
          else {
            length = 0;
          }
          updateHashChain(hash,_error & windowsize - 1,uVar3,(unsigned_short)length);
        }
      }
    }
    else {
      if ((((bVar1) || (lazylength < 3)) || (uVar2 < lazylength)) || (0x101 < lazylength)) {
        if (bVar1) {
          bVar1 = false;
          if (_error == 0) {
            return 0x51;
          }
          if (hashval + 1 < lazylength) {
            uVar3 = uivector_push_back(out,(uint)in[_error - 1]);
            if (uVar3 == 0) {
              return 0x53;
            }
          }
          else {
            lazylength = hashval;
            lazy = current_offset;
            hash->head[uVar3] = -1;
            hash->headz[length] = -1;
            _error = _error - 1;
          }
        }
        goto LAB_0012b4e9;
      }
      bVar1 = true;
      hashval = lazylength;
      current_offset = lazy;
    }
    _error = _error + 1;
  } while( true );
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}